

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_intra_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,BLOCK_SIZE bsize,aom_reader *r,int skip)

{
  int iVar1;
  int iVar2;
  uint x_mis_00;
  uint y_mis_00;
  byte in_DL;
  int *in_RSI;
  long in_RDI;
  int segment_id;
  int y_mis;
  int x_mis;
  int bh;
  int bw;
  int mi_offset;
  int mi_stride;
  int mi_col;
  int mi_row;
  CommonModeInfoParams *mi_params;
  segmentation *seg;
  uint8_t in_stack_ffffffffffffff8f;
  int in_stack_ffffffffffffff90;
  uint uVar3;
  uint uVar4;
  int local_4;
  
  if ((((AV1_COMMON *)(in_RDI + 19000))->current_frame).frame_type == '\0') {
    local_4 = 0;
  }
  else {
    iVar1 = *in_RSI;
    iVar2 = in_RSI[1];
    x_mis_00 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [in_DL];
    y_mis_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [in_DL];
    if (*(int *)(in_RDI + 0x218) - iVar2 < (int)x_mis_00) {
      x_mis_00 = *(int *)(in_RDI + 0x218) - iVar2;
    }
    if (*(int *)(in_RDI + 0x214) - iVar1 < (int)y_mis_00) {
      y_mis_00 = *(int *)(in_RDI + 0x214) - iVar1;
    }
    uVar3 = y_mis_00;
    uVar4 = x_mis_00;
    local_4 = read_segment_id((AV1_COMMON *)(in_RDI + 19000),(MACROBLOCKD *)(in_RDI + 0x208),
                              (aom_reader *)CONCAT44(iVar1,iVar2),*(int *)(in_RDI + 0x218));
    set_segment_id((uint8_t *)CONCAT44(uVar4,uVar3),local_4,x_mis_00,y_mis_00,
                   in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  }
  return local_4;
}

Assistant:

static int read_intra_segment_id(AV1_COMMON *const cm,
                                 const MACROBLOCKD *const xd, BLOCK_SIZE bsize,
                                 aom_reader *r, int skip) {
  struct segmentation *const seg = &cm->seg;
  if (!seg->enabled) return 0;  // Default for disabled segmentation
  assert(seg->update_map && !seg->temporal_update);

  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_stride = cm->mi_params.mi_cols;
  const int mi_offset = mi_row * mi_stride + mi_col;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int x_mis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int y_mis = AOMMIN(mi_params->mi_rows - mi_row, bh);
  const int segment_id = read_segment_id(cm, xd, r, skip);
  set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                 segment_id);
  return segment_id;
}